

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SiameseDecoder.cpp
# Opt level: O2

SiameseResult __thiscall siamese::Decoder::Get(Decoder *this,SiameseOriginalPacket *packetOut)

{
  DecoderSubwindow *pDVar1;
  SiameseResult SVar2;
  uint uVar3;
  uint uVar4;
  uchar *puVar5;
  OriginalPacket *pOVar6;
  
  if ((this->Window).EmergencyDisabled != false) {
    return Siamese_Disabled;
  }
  uVar3 = packetOut->PacketNum - (this->Window).ColumnStart;
  uVar4 = uVar3 & 0x3fffff;
  SVar2 = Siamese_NeedMoreData;
  if (uVar4 < (this->Window).Count) {
    uVar3 = uVar3 & 0x3f;
    pDVar1 = (this->Window).Subwindows.DataPtr[uVar4 >> 6];
    uVar4 = (pDVar1->Originals)._M_elems[uVar3].Buffer.Bytes;
    if (uVar4 != 0) {
      pOVar6 = (pDVar1->Originals)._M_elems + uVar3;
      SVar2 = Siamese_Success;
      uVar3 = pOVar6->HeaderBytes;
      uVar4 = uVar4 - uVar3;
      puVar5 = (pOVar6->Buffer).Data + uVar3;
      goto LAB_00167f1e;
    }
  }
  puVar5 = (uchar *)0x0;
  uVar4 = 0;
LAB_00167f1e:
  packetOut->Data = puVar5;
  packetOut->DataBytes = uVar4;
  return SVar2;
}

Assistant:

SiameseResult Decoder::Get(SiameseOriginalPacket& packetOut)
{
    // Note: Keep this in sync with Encoder::Get

    if (Window.EmergencyDisabled) {
        return Siamese_Disabled;
    }

    // Note: This also works when Count == 0
    const unsigned element = Window.ColumnToElement(packetOut.PacketNum);
    if (Window.InvalidElement(element))
    {
        // Set default return value
        packetOut.Data      = nullptr;
        packetOut.DataBytes = 0;
        return Siamese_NeedMoreData;
    }

    // Return the packet data
    OriginalPacket* original = Window.GetWindowElement(element);
    if (original->Buffer.Bytes <= 0)
    {
        packetOut.Data      = nullptr;
        packetOut.DataBytes = 0;
        return Siamese_NeedMoreData;
    }

    const unsigned headerBytes = original->HeaderBytes;
    SIAMESE_DEBUG_ASSERT(headerBytes > 0 && original->Buffer.Bytes > headerBytes);
    const unsigned length = original->Buffer.Bytes - headerBytes;

#ifdef SIAMESE_DEBUG
    // Check: Deserialize length from the front
    unsigned lengthCheck;
    int headerBytesCheck = DeserializeHeader_PacketLength(
        original->Buffer.Data,
        original->Buffer.Bytes,
        lengthCheck);

    if (lengthCheck != length || (int)headerBytes != headerBytesCheck ||
        headerBytesCheck < 1 || lengthCheck == 0 ||
        lengthCheck + headerBytesCheck != original->Buffer.Bytes)
    {
        SIAMESE_DEBUG_BREAK(); // Invalid input
        Window.EmergencyDisabled = true;
        return Siamese_Disabled;
    }
#endif // SIAMESE_DEBUG

    packetOut.Data      = original->Buffer.Data + headerBytes;
    packetOut.DataBytes = length;
    return Siamese_Success;
}